

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThree.cpp
# Opt level: O1

void __thiscall chrono::ChConstraintThree::ArchiveIN(ChConstraintThree *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChConstraintThree>(marchive);
  ChConstraint::ArchiveIN(&this->super_ChConstraint,marchive);
  return;
}

Assistant:

void ChConstraintThree::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraintThree>();

    // deserialize the parent class data too
    ChConstraint::ArchiveIN(marchive);

    // stream in all member data:
    // NOTHING INTERESTING TO SERIALIZE (pointers to variables must be rebound in run-time.)
}